

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRExpression * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::
allocate<std::__cxx11::string,unsigned_int&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRExpression> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p,uint *p_1,bool *p_2)

{
  Vector<diligent_spirv_cross::SPIRExpression_*> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
  _Var2;
  ulong count;
  _Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> _Var3;
  size_t sVar4;
  SPIRExpression *this_01;
  string local_50;
  
  this_00 = &this->vacants;
  sVar4 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size;
  if (sVar4 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>)malloc(count * 0xf0);
    if (_Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl ==
        (SPIRExpression *)0x0) {
      return (SPIRExpression *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,count);
    if (count != 0) {
      sVar4 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size;
      _Var3._M_head_impl =
           (SPIRExpression *)
           _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      do {
        SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,sVar4 + 1);
        sVar4 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size
        ;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.ptr[sVar4] =
             _Var3._M_head_impl;
        sVar4 = sVar4 + 1;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size = sVar4
        ;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        count = count - 1;
      } while (count != 0);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,
              (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
              .buffer_size + 1);
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
    .ptr[sVar4]._M_t.
    super___uniq_ptr_impl<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExpression_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>
    .super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false> =
         _Var2.super__Head_base<0UL,_diligent_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
    .buffer_size = sVar4 + 1;
    sVar4 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>.ptr
              [sVar4 - 1];
    if (sVar4 == 0) goto LAB_0078e402;
  }
  else {
    this_01 = (this_00->super_VectorView<diligent_spirv_cross::SPIRExpression_*>).ptr[sVar4 - 1];
  }
  SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::resize(this_00,sVar4 - 1);
LAB_0078e402:
  local_50._M_dataplus._M_p = (p->_M_dataplus)._M_p;
  paVar1 = &p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&p->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50._M_string_length = p->_M_string_length;
  (p->_M_dataplus)._M_p = (pointer)paVar1;
  p->_M_string_length = 0;
  (p->field_2)._M_local_buf[0] = '\0';
  SPIRExpression::SPIRExpression(this_01,&local_50,(TypeID)*p_1,*p_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}